

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O1

void __thiscall olc::PixelGameEngine::olc_ConfigureSystem(PixelGameEngine *this)

{
  long lVar1;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)operator_new(8);
  *puVar2 = &PTR__ImageLoader_0011bb70;
  if (Sprite::loader != (long *)0x0) {
    lVar1 = *Sprite::loader;
    Sprite::loader = puVar2;
    (**(code **)(lVar1 + 8))();
    puVar2 = Sprite::loader;
  }
  Sprite::loader = puVar2;
  puVar2 = (undefined8 *)operator_new(0xa0);
  memset(puVar2,0,0xa0);
  *puVar2 = &PTR__Platform_0011bbc8;
  puVar2[1] = 0;
  if (platform != (long *)0x0) {
    lVar1 = *platform;
    platform = puVar2;
    (**(code **)(lVar1 + 8))();
    puVar2 = platform;
  }
  platform = puVar2;
  puVar2 = (undefined8 *)operator_new(0x38);
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  puVar2[3] = 0;
  puVar2[4] = 0;
  puVar2[5] = 0;
  puVar2[6] = 0;
  *puVar2 = &PTR__Renderer_0011bc58;
  puVar2[1] = 0;
  puVar2[2] = 0;
  *(undefined1 *)(puVar2 + 3) = 0;
  *(undefined4 *)((long)puVar2 + 0x1c) = 0xffffffff;
  if (renderer != (long *)0x0) {
    lVar1 = *renderer;
    renderer = puVar2;
    (**(code **)(lVar1 + 8))();
    puVar2 = renderer;
  }
  renderer = puVar2;
  Platform::ptrPGE = this;
  Renderer::ptrPGE = this;
  return;
}

Assistant:

void PixelGameEngine::olc_ConfigureSystem()
	{

#if defined(OLC_IMAGE_GDI)
		olc::Sprite::loader = std::make_unique<olc::ImageLoader_GDIPlus>();
#endif

#if defined(OLC_IMAGE_LIBPNG)
		olc::Sprite::loader = std::make_unique<olc::ImageLoader_LibPNG>();
#endif

#if defined(OLC_IMAGE_STB)
		olc::Sprite::loader = std::make_unique<olc::ImageLoader_STB>();
#endif

#if defined(OLC_IMAGE_CUSTOM_EX)
		olc::Sprite::loader = std::make_unique<OLC_IMAGE_CUSTOM_EX>();
#endif




#if defined(OLC_PLATFORM_WINAPI)
		platform = std::make_unique<olc::Platform_Windows>();
#endif

#if defined(OLC_PLATFORM_X11)
		platform = std::make_unique<olc::Platform_Linux>();
#endif

#if defined(OLC_PLATFORM_GLUT)
		platform = std::make_unique<olc::Platform_GLUT>();
#endif

#if defined(OLC_PLATFORM_EMSCRIPTEN)
		platform = std::make_unique<olc::Platform_Emscripten>();
#endif

#if defined(OLC_PLATFORM_CUSTOM_EX)
		platform = std::make_unique<OLC_PLATFORM_CUSTOM_EX>();
#endif



#if defined(OLC_GFX_OPENGL10)
		renderer = std::make_unique<olc::Renderer_OGL10>();
#endif

#if defined(OLC_GFX_OPENGL33)
		renderer = std::make_unique<olc::Renderer_OGL33>();
#endif

#if defined(OLC_GFX_OPENGLES2)
		renderer = std::make_unique<olc::Renderer_OGLES2>();
#endif

#if defined(OLC_GFX_DIRECTX10)
		renderer = std::make_unique<olc::Renderer_DX10>();
#endif

#if defined(OLC_GFX_DIRECTX11)
		renderer = std::make_unique<olc::Renderer_DX11>();
#endif

#if defined(OLC_GFX_CUSTOM_EX)
		renderer = std::make_unique<OLC_RENDERER_CUSTOM_EX>();
#endif

		// Associate components with PGE instance
		platform->ptrPGE = this;
		renderer->ptrPGE = this;
	}